

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

_Bool cs_disasm_iter(csh ud,uint8_t **code,size_t *size,uint64_t *address,cs_insn *insn)

{
  char cVar1;
  ulong uVar2;
  size_t __n;
  uint16_t insn_size;
  SStream ss;
  MCInst mci;
  uint16_t local_566;
  SStream local_564;
  MCInst local_360;
  
  if (ud != 0) {
    *(undefined4 *)(ud + 0x58) = 0;
    MCInst_Init(&local_360);
    local_360.address = *address;
    insn->address = local_360.address;
    local_360.flat_insn = insn;
    local_360.csh = (cs_struct *)ud;
    cVar1 = (**(code **)(ud + 0x18))
                      (ud,*code,*size,&local_360,&local_566,*address,*(undefined8 *)(ud + 0x20));
    if (cVar1 != '\0') {
      SStream_Init(&local_564);
      (local_360.flat_insn)->size = local_566;
      (**(code **)(ud + 0x48))(ud,insn,local_360.Opcode);
      (**(code **)(ud + 8))(&local_360,&local_564,*(undefined8 *)(ud + 0x10));
      fill_insn((cs_struct *)ud,insn,local_564.buffer,&local_360,*(PostPrinter_t *)(ud + 0x50),*code
               );
      uVar2 = (ulong)local_566;
      *code = *code + uVar2;
      *size = *size - uVar2;
      *address = *address + uVar2;
      return true;
    }
    if (*(char *)(ud + 0x88) == '\x01') {
      __n = (size_t)*(byte *)(ud + 0x89);
      if (__n <= *size) {
        if ((*(code **)(ud + 0x98) != (code *)0x0) &&
           (__n = (**(code **)(ud + 0x98))(*code,*size,0,*(undefined8 *)(ud + 0xa0)),
           *size <= __n - 1)) {
          return false;
        }
        insn->id = 0;
        insn->address = *address;
        insn->size = (uint16_t)__n;
        memcpy(insn->bytes,*code,__n);
        strncpy(insn->mnemonic,*(char **)(ud + 0x90),0x1f);
        skipdata_opstr(insn->op_str,*code,__n);
        *code = *code + __n;
        *size = *size - __n;
        *address = *address + __n;
        return true;
      }
    }
  }
  return false;
}

Assistant:

CAPSTONE_API cs_disasm_iter(csh ud, const uint8_t **code, size_t *size,
		uint64_t *address, cs_insn *insn)
{
	struct cs_struct *handle;
	uint16_t insn_size;
	MCInst mci;
	bool r;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		return false;
	}

	handle->errnum = CS_ERR_OK;

	MCInst_Init(&mci);
	mci.csh = handle;

	// relative branches need to know the address & size of current insn
	mci.address = *address;

	// save all the information for non-detailed mode
	mci.flat_insn = insn;
	mci.flat_insn->address = *address;
#ifdef CAPSTONE_DIET
	// zero out mnemonic & op_str
	mci.flat_insn->mnemonic[0] = '\0';
	mci.flat_insn->op_str[0] = '\0';
#endif

	r = handle->disasm(ud, *code, *size, &mci, &insn_size, *address, handle->getinsn_info);
	if (r) {
		SStream ss;
		SStream_Init(&ss);

		mci.flat_insn->size = insn_size;

		// map internal instruction opcode to public insn ID
		handle->insn_id(handle, insn, mci.Opcode);

		handle->printer(&mci, &ss, handle->printer_info);

		fill_insn(handle, insn, ss.buffer, &mci, handle->post_printer, *code);

		*code += insn_size;
		*size -= insn_size;
		*address += insn_size;
	} else { 	// encounter a broken instruction
		size_t skipdata_bytes;

		// if there is no request to skip data, or remaining data is too small,
		// then bail out
		if (!handle->skipdata || handle->skipdata_size > *size)
			return false;

		if (handle->skipdata_setup.callback) {
			skipdata_bytes = handle->skipdata_setup.callback(*code, *size,
					0, handle->skipdata_setup.user_data);
			if (skipdata_bytes > *size)
				// remaining data is not enough
				return false;

			if (!skipdata_bytes)
				// user requested not to skip data, so bail out
				return false;
		} else
			skipdata_bytes = handle->skipdata_size;

		// we have to skip some amount of data, depending on arch & mode
		insn->id = 0;	// invalid ID for this "data" instruction
		insn->address = *address;
		insn->size = (uint16_t)skipdata_bytes;
		memcpy(insn->bytes, *code, skipdata_bytes);
		strncpy(insn->mnemonic, handle->skipdata_setup.mnemonic,
				sizeof(insn->mnemonic) - 1);
		skipdata_opstr(insn->op_str, *code, skipdata_bytes);

		*code += skipdata_bytes;
		*size -= skipdata_bytes;
		*address += skipdata_bytes;
	}

	return true;
}